

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O0

void __thiscall
Js::InterpreterStackFrame::ProcessTryHandlerBailout
          (InterpreterStackFrame *this,EHBailoutData *ehBailoutData,uint32 tryNestingDepth)

{
  short sVar1;
  int byteOffset;
  ScriptContext *scriptContext;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  ThreadContext *pTVar5;
  void *pvVar6;
  undefined4 *puVar7;
  OpLayoutBrLong *pOVar8;
  int finallyEndOffset_2;
  OpLayoutBrLong *playoutBrLong_2;
  uint uStack_a0;
  OpCode finallyOp_1;
  LayoutSize layoutSize_2;
  int currOffset;
  int finallyEndOffset_1;
  OpLayoutBrLong *playoutBrLong_1;
  OpCode finallyOp;
  LayoutSize layoutSize_1;
  RegSlot reg;
  OpLayoutBrLong *playoutBrLong;
  OpCode catchOp;
  LayoutSize layoutSize;
  Var catchObject;
  JavascriptExceptionObject *pJStack_60;
  int finallyEndOffset;
  JavascriptExceptionObject *exceptionObj;
  JavascriptException *err;
  AutoCatchHandlerExists autoCatchHandlerExists;
  JavascriptExceptionObject *exception;
  int finallyOffset;
  int catchOffset;
  uint32 tryNestingDepth_local;
  EHBailoutData *ehBailoutData_local;
  InterpreterStackFrame *this_local;
  
  iVar4 = ehBailoutData->catchOffset;
  byteOffset = ehBailoutData->finallyOffset;
  if ((iVar4 == 0) && (byteOffset == 0)) {
    if (ehBailoutData->ht == HT_Catch) {
      *(short *)(this + 0xde) = *(short *)(this + 0xde) + 1;
      OrFlags(this,2);
      if (tryNestingDepth != 0) {
        ProcessTryHandlerBailout(this,ehBailoutData->child,tryNestingDepth - 1);
      }
      ProcessCatch(this);
      sVar1 = *(short *)(this + 0xde);
      *(short *)(this + 0xde) = sVar1 + -1;
      if ((short)(sVar1 + -1) == -1) {
        ClearFlags(this,2);
      }
    }
    else {
      if (ehBailoutData->ht != HT_Finally) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                    ,0x1b10,"(ehBailoutData->ht == HandlerType::HT_Finally)",
                                    "ehBailoutData->ht == HandlerType::HT_Finally");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 0;
      }
      *(short *)(this + 0xe4) = *(short *)(this + 0xe4) + 1;
      OrFlags(this,4);
      if (tryNestingDepth != 0) {
        ProcessTryHandlerBailout(this,ehBailoutData->child,tryNestingDepth - 1);
      }
      pTVar5 = ScriptContext::GetThreadContext(*(ScriptContext **)(this + 0x78));
      pJStack_60 = ThreadContext::GetPendingFinallyException(pTVar5);
      pTVar5 = ScriptContext::GetThreadContext(*(ScriptContext **)(this + 0x78));
      ThreadContext::SetPendingFinallyException(pTVar5,(JavascriptExceptionObject *)0x0);
      catchObject._4_4_ = ProcessFinally(this);
      sVar1 = *(short *)(this + 0xe4);
      *(short *)(this + 0xe4) = sVar1 + -1;
      if ((short)(sVar1 + -1) == -1) {
        ClearFlags(this,4);
      }
      if ((catchObject._4_4_ == 0) && (pJStack_60 != (JavascriptExceptionObject *)0x0)) {
        pTVar5 = ScriptContext::GetThreadContext(*(ScriptContext **)(this + 0x78));
        pvVar6 = ThreadContext::GetTryHandlerAddrOfReturnAddr(pTVar5);
        if (pvVar6 != (void *)0x0) {
          scriptContext = *(ScriptContext **)(this + 0x78);
          pTVar5 = ScriptContext::GetThreadContext(*(ScriptContext **)(this + 0x78));
          pvVar6 = ThreadContext::GetTryHandlerAddrOfReturnAddr(pTVar5);
          JavascriptExceptionOperators::WalkStackForCleaningUpInlineeInfo
                    (scriptContext,(PVOID)0x0,pvVar6);
        }
        JavascriptExceptionOperators::DoThrow(pJStack_60,*(ScriptContext **)(this + 0x78));
      }
      if (catchObject._4_4_ != 0) {
        ByteCodeReader::SetCurrentOffset((ByteCodeReader *)this,catchObject._4_4_);
      }
    }
  }
  else {
    *(short *)(this + 0xdc) = *(short *)(this + 0xdc) + 1;
    OrFlags(this,1);
    if (byteOffset != 0) {
      OrFlags(this,0x100);
    }
    if (tryNestingDepth != 0) {
      ProcessTryHandlerBailout(this,ehBailoutData->child,tryNestingDepth - 1);
    }
    if (iVar4 != 0) {
      JavascriptExceptionOperators::AutoCatchHandlerExists::AutoCatchHandlerExists
                ((AutoCatchHandlerExists *)&err,*(ScriptContext **)(this + 0x78),true);
      JavascriptExceptionOperators::AutoCatchHandlerExists::~AutoCatchHandlerExists
                ((AutoCatchHandlerExists *)&err);
    }
    bVar3 = IsInDebugMode(this);
    if (bVar3) {
      bVar3 = ScriptContext::ShouldPerformRecordOrReplayDebuggerAction
                        (*(ScriptContext **)(this + 0x78));
      if (bVar3) {
        ProcessWithDebugging_PreviousStmtTracking(this);
      }
      else {
        ProcessWithDebugging(this);
      }
      TrySetRetOffset(this);
    }
    else {
      Process(this);
      TrySetRetOffset(this);
    }
    sVar1 = *(short *)(this + 0xdc);
    *(short *)(this + 0xdc) = sVar1 + -1;
    if ((short)(sVar1 + -1) == -1) {
      ClearFlags(this,0x101);
    }
    if (byteOffset != 0) {
      uStack_a0 = ByteCodeReader::GetCurrentOffset((ByteCodeReader *)this);
      ByteCodeReader::SetCurrentOffset((ByteCodeReader *)this,byteOffset);
      *(short *)(this + 0xe4) = *(short *)(this + 0xe4) + 1;
      OrFlags(this,4);
      playoutBrLong_2._2_2_ =
           ByteCodeReader::ReadOp((ByteCodeReader *)this,(LayoutSize *)((long)&playoutBrLong_2 + 4))
      ;
      if (playoutBrLong_2._2_2_ == BrLong) {
        if (playoutBrLong_2._4_4_ != 0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar7 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                      ,0x1ba2,"(layoutSize == SmallLayout)",
                                      "layoutSize == SmallLayout");
          if (!bVar3) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar7 = 0;
        }
        pOVar8 = ByteCodeReader::BrLong((ByteCodeReader *)this);
        ByteCodeReader::SetCurrentRelativeOffset
                  ((ByteCodeReader *)this,(byte *)(pOVar8 + 1),pOVar8->RelativeJumpOffset);
        playoutBrLong_2._2_2_ =
             ByteCodeReader::ReadOp
                       ((ByteCodeReader *)this,(LayoutSize *)((long)&playoutBrLong_2 + 4));
      }
      if (playoutBrLong_2._2_2_ != Finally) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                    ,0x1ba8,"(finallyOp == Js::OpCode::Finally)",
                                    "finallyOp == Js::OpCode::Finally");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 0;
      }
      iVar4 = ProcessFinally(this);
      sVar1 = *(short *)(this + 0xe4);
      *(short *)(this + 0xe4) = sVar1 + -1;
      if ((short)(sVar1 + -1) == -1) {
        ClearFlags(this,4);
      }
      if (iVar4 == 0) {
        ByteCodeReader::SetCurrentOffset((ByteCodeReader *)this,uStack_a0);
      }
    }
  }
  return;
}

Assistant:

void InterpreterStackFrame::ProcessTryHandlerBailout(EHBailoutData * ehBailoutData, uint32 tryNestingDepth)
    {
        int catchOffset = ehBailoutData->catchOffset;
        int finallyOffset = ehBailoutData->finallyOffset;
        Js::JavascriptExceptionObject* exception = NULL;

        if (catchOffset != 0 || finallyOffset != 0)
        {
            try
            {
                this->nestedTryDepth++;
                // mark the stackFrame as 'in try block'
                this->OrFlags(InterpreterStackFrameFlags_WithinTryBlock);

                if (finallyOffset != 0)
                {
                    this->OrFlags(InterpreterStackFrameFlags_WithinTryFinallyBlock);
                }

                if (tryNestingDepth != 0)
                {
                    this->ProcessTryHandlerBailout(ehBailoutData->child, --tryNestingDepth);
                }

                if (catchOffset != 0)
                {
                    Js::JavascriptExceptionOperators::AutoCatchHandlerExists autoCatchHandlerExists(scriptContext);
                }

#ifdef ENABLE_SCRIPT_DEBUGGING
                if (this->IsInDebugMode())
                {
#if ENABLE_TTD
                    if (SHOULD_DO_TTD_STACK_STMT_OP(this->scriptContext))
                    {
                        this->ProcessWithDebugging_PreviousStmtTracking();
                    }
                    else
                    {
                        this->ProcessWithDebugging();
                    }
#else
                    this->ProcessWithDebugging();
#endif

                    this->TrySetRetOffset();
                }
                else
#endif
                {
                    this->Process();
                    this->TrySetRetOffset();
                }
            }
            catch (const Js::JavascriptException& err)
            {
                // We are using C++ exception handling which does not unwind the stack in the catch block.
                // For stack overflow and OOM exceptions, we cannot run user code here because the stack is not unwind.
                exception = err.GetAndClear();
            }
        }
        else if (ehBailoutData->ht == HandlerType::HT_Catch)
        {
            this->nestedCatchDepth++;
            // mark the stackFrame as 'in catch block'
            this->OrFlags(InterpreterStackFrameFlags_WithinCatchBlock);

            if (tryNestingDepth != 0)
            {
                this->ProcessTryHandlerBailout(ehBailoutData->child, --tryNestingDepth);
            }
            this->ProcessCatch();

            if (--this->nestedCatchDepth == -1)
            {
                // unmark the stackFrame as 'in catch block'
                this->ClearFlags(InterpreterStackFrameFlags_WithinCatchBlock);
            }
            return;
        }
        else
        {
            Assert(ehBailoutData->ht == HandlerType::HT_Finally);
            this->nestedFinallyDepth++;
            // mark the stackFrame as 'in finally block'
            this->OrFlags(InterpreterStackFrameFlags_WithinFinallyBlock);

            if (tryNestingDepth != 0)
            {
                this->ProcessTryHandlerBailout(ehBailoutData->child, --tryNestingDepth);
            }

            Js::JavascriptExceptionObject * exceptionObj = this->scriptContext->GetThreadContext()->GetPendingFinallyException();
            this->scriptContext->GetThreadContext()->SetPendingFinallyException(nullptr);

            int finallyEndOffset = this->ProcessFinally();

            if (--this->nestedFinallyDepth == -1)
            {
                // unmark the stackFrame as 'in finally block'
                this->ClearFlags(InterpreterStackFrameFlags_WithinFinallyBlock);
            }

            // Finally exited with LeaveNull, We don't throw for early returns
            if (finallyEndOffset == 0 && exceptionObj)
            {
#if ENABLE_NATIVE_CODEGEN
                if (scriptContext->GetThreadContext()->GetTryHandlerAddrOfReturnAddr() != nullptr)
                {
                    JavascriptExceptionOperators::WalkStackForCleaningUpInlineeInfo(scriptContext, nullptr, scriptContext->GetThreadContext()->GetTryHandlerAddrOfReturnAddr());
                }
#endif
                JavascriptExceptionOperators::DoThrow(const_cast<Js::JavascriptExceptionObject *>(exceptionObj), scriptContext);
            }
            if (finallyEndOffset != 0)
            {
                m_reader.SetCurrentOffset(finallyEndOffset);
            }

            return;
        }

        if (--this->nestedTryDepth == -1)
        {
            // unmark the stackFrame as 'in try block'
            this->ClearFlags(InterpreterStackFrameFlags_WithinTryBlock | InterpreterStackFrameFlags_WithinTryFinallyBlock);
        }

        // Now that the stack is unwound, let's run the catch block.
        if (exception)
        {
            if (catchOffset != 0)
            {
                exception = exception->CloneIfStaticExceptionObject(scriptContext);
                // We've got a JS exception. Grab the exception object and assign it to the
                // catch object's location, then call the handler (i.e., we consume the Catch op here).
                Var catchObject = exception->GetThrownObject(scriptContext);

                m_reader.SetCurrentOffset(catchOffset);

                LayoutSize layoutSize;
                OpCode catchOp = m_reader.ReadOp(layoutSize);
#ifdef BYTECODE_BRANCH_ISLAND
                if (catchOp == Js::OpCode::BrLong)
                {
                    Assert(layoutSize == SmallLayout);
                    auto playoutBrLong = m_reader.BrLong();
                    m_reader.SetCurrentRelativeOffset((const byte *)(playoutBrLong + 1), playoutBrLong->RelativeJumpOffset);
                    catchOp = m_reader.ReadOp(layoutSize);
                }
#endif
                AssertMsg(catchOp == OpCode::Catch, "Catch op not found at catch offset");
                RegSlot reg = layoutSize == SmallLayout ? m_reader.Reg1_Small()->R0 :
                    layoutSize == MediumLayout ? m_reader.Reg1_Medium()->R0 : m_reader.Reg1_Large()->R0;
                SetReg(reg, catchObject);

                ResetOut();

                this->nestedCatchDepth++;
                // mark the stackFrame as 'in catch block'
                this->OrFlags(InterpreterStackFrameFlags_WithinCatchBlock);

                this->ProcessCatch();

                if (--this->nestedCatchDepth == -1)
                {
                    // unmark the stackFrame as 'in catch block'
                    this->ClearFlags(InterpreterStackFrameFlags_WithinCatchBlock);
                }
            }
            else
            {
                Assert(finallyOffset != 0);
                exception = exception->CloneIfStaticExceptionObject(scriptContext);

                m_reader.SetCurrentOffset(finallyOffset);

                ResetOut();

                this->nestedFinallyDepth++;
                // mark the stackFrame as 'in finally block'
                this->OrFlags(InterpreterStackFrameFlags_WithinFinallyBlock);

                LayoutSize layoutSize;
                OpCode finallyOp = m_reader.ReadOp(layoutSize);
#ifdef BYTECODE_BRANCH_ISLAND
                if (finallyOp == Js::OpCode::BrLong)
                {
                    Assert(layoutSize == SmallLayout);
                    auto playoutBrLong = m_reader.BrLong();
                    m_reader.SetCurrentRelativeOffset((const byte *)(playoutBrLong + 1), playoutBrLong->RelativeJumpOffset);
                    finallyOp = m_reader.ReadOp(layoutSize);
                }
#endif
                Assert(finallyOp == Js::OpCode::Finally);

                int finallyEndOffset = this->ProcessFinally();

                if (--this->nestedFinallyDepth == -1)
                {
                    // unmark the stackFrame as 'in finally block'
                    this->ClearFlags(InterpreterStackFrameFlags_WithinFinallyBlock);
                }
                if (finallyEndOffset == 0)
                {
                    JavascriptExceptionOperators::DoThrow(exception, scriptContext);
                }
                m_reader.SetCurrentOffset(finallyEndOffset);
            }
        }
        else
        {
            if (finallyOffset != 0)
            {
                int currOffset = m_reader.GetCurrentOffset();

                m_reader.SetCurrentOffset(finallyOffset);

                this->nestedFinallyDepth++;

                // mark the stackFrame as 'in finally block'
                this->OrFlags(InterpreterStackFrameFlags_WithinFinallyBlock);

                LayoutSize layoutSize;
                OpCode finallyOp = m_reader.ReadOp(layoutSize);
#ifdef BYTECODE_BRANCH_ISLAND
                if (finallyOp == Js::OpCode::BrLong)
                {
                    Assert(layoutSize == SmallLayout);
                    auto playoutBrLong = m_reader.BrLong();
                    m_reader.SetCurrentRelativeOffset((const byte *)(playoutBrLong + 1), playoutBrLong->RelativeJumpOffset);
                    finallyOp = m_reader.ReadOp(layoutSize);
                }
#endif
                Assert(finallyOp == Js::OpCode::Finally);

                int finallyEndOffset = this->ProcessFinally();

                if (--this->nestedFinallyDepth == -1)
                {
                    // unmark the stackFrame as 'in finally block'
                    this->ClearFlags(InterpreterStackFrameFlags_WithinFinallyBlock);
                }
                if (finallyEndOffset == 0)
                {
                    m_reader.SetCurrentOffset(currOffset);
                }
            }
        }
    }